

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * duckdb::GetContinuousQuantileTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_139;
  LogicalType local_138 [4];
  LogicalType local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(local_138,TINYINT);
  LogicalType::LogicalType(local_138 + 1,SMALLINT);
  LogicalType::LogicalType(local_138 + 2,INTEGER);
  LogicalType::LogicalType(local_138 + 3,BIGINT);
  LogicalType::LogicalType(&local_d8,HUGEINT);
  LogicalType::LogicalType(&local_c0,FLOAT);
  LogicalType::LogicalType(&local_a8,DOUBLE);
  LogicalType::LogicalType(&local_90,DATE);
  LogicalType::LogicalType(&local_78,TIMESTAMP);
  LogicalType::LogicalType(&local_60,TIME);
  LogicalType::LogicalType(&local_48,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_30,TIME_TZ);
  __l._M_len = 0xc;
  __l._M_array = local_138;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_139);
  lVar1 = 0x108;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_138[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

vector<LogicalType> GetContinuousQuantileTypes() {
	return {LogicalType::TINYINT,   LogicalType::SMALLINT, LogicalType::INTEGER,      LogicalType::BIGINT,
	        LogicalType::HUGEINT,   LogicalType::FLOAT,    LogicalType::DOUBLE,       LogicalType::DATE,
	        LogicalType::TIMESTAMP, LogicalType::TIME,     LogicalType::TIMESTAMP_TZ, LogicalType::TIME_TZ};
}